

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZoneFormat::expandOffsetPattern
          (UnicodeString *offsetHM,UnicodeString *result,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString local_190;
  ConstChar16Ptr local_150;
  UnicodeString local_148;
  UnicodeString local_108;
  UnicodeString local_b8;
  int32_t local_74;
  undefined1 local_70 [4];
  int32_t idx_H;
  UnicodeString sep;
  int32_t idx_mm;
  UErrorCode *status_local;
  UnicodeString *result_local;
  UnicodeString *offsetHM_local;
  
  UnicodeString::setToBogus(result);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    sep.fUnion._52_4_ = UnicodeString::indexOf(offsetHM,L"mm",2,0);
    if ((int)sep.fUnion._52_4_ < 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeString::UnicodeString((UnicodeString *)local_70);
      UnicodeString::tempSubString(&local_b8,offsetHM,0,sep.fUnion._52_4_);
      iVar2 = UnicodeString::lastIndexOf(&local_b8,L'H');
      UnicodeString::~UnicodeString(&local_b8);
      local_74 = iVar2;
      if (-1 < iVar2) {
        UnicodeString::tempSubString(&local_108,offsetHM,iVar2 + 1,sep.fUnion._52_4_ - (iVar2 + 1));
        UnicodeString::operator=((UnicodeString *)local_70,&local_108);
        UnicodeString::~UnicodeString(&local_108);
      }
      UnicodeString::tempSubString(&local_148,offsetHM,0,sep.fUnion._52_4_ + 2);
      UnicodeString::setTo(result,&local_148);
      UnicodeString::~UnicodeString(&local_148);
      UnicodeString::append(result,(UnicodeString *)local_70);
      ConstChar16Ptr::ConstChar16Ptr(&local_150,L"ss");
      UnicodeString::append(result,&local_150,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_150);
      UnicodeString::tempSubString(&local_190,offsetHM,sep.fUnion._52_4_ + 2,0x7fffffff);
      UnicodeString::append(result,&local_190);
      UnicodeString::~UnicodeString(&local_190);
      UnicodeString::~UnicodeString((UnicodeString *)local_70);
    }
  }
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::expandOffsetPattern(const UnicodeString& offsetHM, UnicodeString& result, UErrorCode& status) {
    result.setToBogus();
    if (U_FAILURE(status)) {
        return result;
    }
    U_ASSERT(u_strlen(DEFAULT_GMT_OFFSET_MINUTE_PATTERN) == 2);

    int32_t idx_mm = offsetHM.indexOf(DEFAULT_GMT_OFFSET_MINUTE_PATTERN, 2, 0);
    if (idx_mm < 0) {
        // Bad time zone hour pattern data
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    UnicodeString sep;
    int32_t idx_H = offsetHM.tempSubString(0, idx_mm).lastIndexOf((UChar)0x0048 /* H */);
    if (idx_H >= 0) {
        sep = offsetHM.tempSubString(idx_H + 1, idx_mm - (idx_H + 1));
    }
    result.setTo(offsetHM.tempSubString(0, idx_mm + 2));
    result.append(sep);
    result.append(DEFAULT_GMT_OFFSET_SECOND_PATTERN, -1);
    result.append(offsetHM.tempSubString(idx_mm + 2));
    return result;
}